

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall
smf::Option_register::Option_register
          (Option_register *this,string *aDefinition,char aType,string *aDefaultOption,
          string *aModifiedOption)

{
  string *aModifiedOption_local;
  string *aDefaultOption_local;
  char aType_local;
  string *aDefinition_local;
  Option_register *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->defaultOption);
  std::__cxx11::string::string((string *)&this->modifiedOption);
  this->type = 's';
  this->modifiedQ = false;
  setType(this,aType);
  setDefinition(this,aDefinition);
  setDefault(this,aDefaultOption);
  setModified(this,aModifiedOption);
  return;
}

Assistant:

Option_register::Option_register(const std::string& aDefinition, char aType,
      const std::string& aDefaultOption, const std::string& aModifiedOption) {
   type = 's';
   modifiedQ = 0;
   setType(aType);
   setDefinition(aDefinition);
   setDefault(aDefaultOption);
   setModified(aModifiedOption);
}